

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gru.cc
# Opt level: O1

Expression __thiscall cnn::GRUBuilder::add_input_impl(GRUBuilder *this,int prev,Expression *x)

{
  vector<std::vector<cnn::expr::Expression,std::allocator<cnn::expr::Expression>>,std::allocator<std::vector<cnn::expr::Expression,std::allocator<cnn::expr::Expression>>>>
  *this_00;
  undefined8 *puVar1;
  long *plVar2;
  long lVar3;
  undefined8 *in_RCX;
  long lVar4;
  ulong uVar5;
  undefined4 in_register_00000034;
  uint uVar6;
  long lVar7;
  bool bVar8;
  bool bVar9;
  double __x;
  double __x_00;
  Expression EVar10;
  Expression ct;
  Expression rt;
  Expression zt;
  Expression nwt;
  Expression ght;
  Expression h_tprev;
  Expression ft;
  Expression crt;
  Expression local_148;
  undefined1 local_138 [8];
  ulong local_130;
  Expression local_128;
  ComputationGraph local_118;
  undefined4 local_e0;
  ComputationGraph *local_d8;
  uint local_d0;
  initializer_list<cnn::expr::Expression> local_c8;
  uint local_b4;
  Expression local_b0;
  long local_a0;
  ComputationGraph *local_98;
  long local_90;
  Expression local_88;
  long local_78;
  initializer_list<cnn::expr::Expression> local_70;
  undefined1 local_60 [8];
  size_type local_58;
  GRUBuilder *local_50;
  ulong local_48;
  long *local_40;
  vector<std::vector<cnn::expr::Expression,std::allocator<cnn::expr::Expression>>,std::allocator<std::vector<cnn::expr::Expression,std::allocator<cnn::expr::Expression>>>>
  *local_38;
  
  local_78 = CONCAT44(in_register_00000034,prev);
  local_b4 = (uint)x;
  lVar4 = *(long *)(local_78 + 0x70);
  lVar7 = *(long *)(local_78 + 0x78);
  this_00 = (vector<std::vector<cnn::expr::Expression,std::allocator<cnn::expr::Expression>>,std::allocator<std::vector<cnn::expr::Expression,std::allocator<cnn::expr::Expression>>>>
             *)(local_78 + 0x58);
  std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::vector
            ((vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_> *)&local_118,
             (ulong)*(uint *)(local_78 + 0x8c),(allocator_type *)&local_b0);
  local_38 = this_00;
  std::
  vector<std::vector<cnn::expr::Expression,std::allocator<cnn::expr::Expression>>,std::allocator<std::vector<cnn::expr::Expression,std::allocator<cnn::expr::Expression>>>>
  ::emplace_back<std::vector<cnn::expr::Expression,std::allocator<cnn::expr::Expression>>>
            (this_00,(vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_> *)
                     &local_118);
  local_50 = this;
  if (local_118.nodes.super__Vector_base<cnn::Node_*,_std::allocator<cnn::Node_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_118.nodes.super__Vector_base<cnn::Node_*,_std::allocator<cnn::Node_*>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  local_90 = *(long *)(local_78 + 0x60);
  if (*(int *)(local_78 + 0x8c) != 0) {
    local_40 = (long *)(local_78 + 0x70);
    bVar8 = lVar7 != lVar4;
    uVar6 = *(uint *)(in_RCX + 1);
    bVar9 = -1 < (int)local_b4;
    local_48 = (ulong)local_b4;
    lVar4 = 8;
    lVar7 = 0;
    uVar5 = 0;
    local_118.parameter_nodes.
    super__Vector_base<cnn::VariableIndex,_std::allocator<cnn::VariableIndex>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)*in_RCX;
    do {
      local_a0 = *(long *)(local_78 + 0x40);
      local_b0.pg = (ComputationGraph *)0x0;
      local_b0.i.t = 0;
      if (bVar9 || bVar8) {
        plVar2 = (long *)(local_48 * 0x18 + *(long *)local_38);
        if ((int)local_b4 < 0) {
          plVar2 = local_40;
        }
        local_d8 = *(ComputationGraph **)(*plVar2 + -8 + lVar4);
        local_d0 = *(uint *)(*plVar2 + lVar4);
        puVar1 = *(undefined8 **)(local_a0 + lVar7);
        local_118.nodes.super__Vector_base<cnn::Node_*,_std::allocator<cnn::Node_*>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)puVar1[4];
        local_118.nodes.super__Vector_base<cnn::Node_*,_std::allocator<cnn::Node_*>_>._M_impl.
        super__Vector_impl_data._M_finish._0_4_ = *(uint *)(puVar1 + 5);
        local_118.nodes.super__Vector_base<cnn::Node_*,_std::allocator<cnn::Node_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)*puVar1;
        local_118.parameter_nodes.
        super__Vector_base<cnn::VariableIndex,_std::allocator<cnn::VariableIndex>_>._M_impl.
        super__Vector_impl_data._M_start._0_4_ = *(undefined4 *)(puVar1 + 1);
        local_118.ee = (ExecutionEngine *)puVar1[2];
        local_e0 = *(undefined4 *)(puVar1 + 3);
        local_130 = 5;
        local_b0.pg = local_d8;
        local_b0.i.t = local_d0;
      }
      else {
        puVar1 = *(undefined8 **)(local_a0 + lVar7);
        local_118.nodes.super__Vector_base<cnn::Node_*,_std::allocator<cnn::Node_*>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)puVar1[4];
        local_118.nodes.super__Vector_base<cnn::Node_*,_std::allocator<cnn::Node_*>_>._M_impl.
        super__Vector_impl_data._M_finish._0_4_ = *(uint *)(puVar1 + 5);
        local_118.nodes.super__Vector_base<cnn::Node_*,_std::allocator<cnn::Node_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)*puVar1;
        local_118.parameter_nodes.
        super__Vector_base<cnn::VariableIndex,_std::allocator<cnn::VariableIndex>_>._M_impl.
        super__Vector_impl_data._M_start._0_4_ = *(undefined4 *)(puVar1 + 1);
        local_130 = 3;
      }
      local_128.i.t = 0;
      local_128.pg = (ComputationGraph *)0x0;
      local_138 = (undefined1  [8])&local_118;
      local_118.parameter_nodes.
      super__Vector_base<cnn::VariableIndex,_std::allocator<cnn::VariableIndex>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._0_4_ = uVar6;
      local_98 = (ComputationGraph *)
                 local_118.parameter_nodes.
                 super__Vector_base<cnn::VariableIndex,_std::allocator<cnn::VariableIndex>_>._M_impl
                 .super__Vector_impl_data._M_finish;
      expr::detail::f<cnn::AffineTransform,std::initializer_list<cnn::expr::Expression>>
                ((detail *)&local_88,(initializer_list<cnn::expr::Expression> *)local_138);
      local_128.pg = local_88.pg;
      local_128.i.t = local_88.i.t;
      expr::logistic((expr *)&local_118,&local_128);
      local_128.pg = (ComputationGraph *)
                     local_118.nodes.super__Vector_base<cnn::Node_*,_std::allocator<cnn::Node_*>_>.
                     _M_impl.super__Vector_impl_data._M_start;
      local_128.i.t =
           (uint)local_118.nodes.super__Vector_base<cnn::Node_*,_std::allocator<cnn::Node_*>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
      expr::operator-((expr *)&local_88,1.0,&local_128);
      local_138 = (undefined1  [8])0x0;
      local_130 = local_130 & 0xffffffff00000000;
      if (bVar9 || bVar8) {
        lVar3 = *(long *)(local_a0 + lVar7);
        local_118.nodes.super__Vector_base<cnn::Node_*,_std::allocator<cnn::Node_*>_>._M_impl.
        super__Vector_impl_data._M_start = *(pointer *)(lVar3 + 0x50);
        local_118.nodes.super__Vector_base<cnn::Node_*,_std::allocator<cnn::Node_*>_>._M_impl.
        super__Vector_impl_data._M_finish._0_4_ = *(undefined4 *)(lVar3 + 0x58);
        local_118.nodes.super__Vector_base<cnn::Node_*,_std::allocator<cnn::Node_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = *(pointer *)(lVar3 + 0x30);
        local_118.parameter_nodes.
        super__Vector_base<cnn::VariableIndex,_std::allocator<cnn::VariableIndex>_>._M_impl.
        super__Vector_impl_data._M_start._0_4_ = *(undefined4 *)(lVar3 + 0x38);
        local_118.ee = *(ExecutionEngine **)(lVar3 + 0x40);
        local_e0 = *(undefined4 *)(lVar3 + 0x48);
        local_d8 = local_b0.pg;
        local_d0 = local_b0.i.t;
        local_c8._M_len = 5;
      }
      else {
        lVar3 = *(long *)(local_a0 + lVar7);
        local_118.nodes.super__Vector_base<cnn::Node_*,_std::allocator<cnn::Node_*>_>._M_impl.
        super__Vector_impl_data._M_start = *(pointer *)(lVar3 + 0x50);
        local_118.nodes.super__Vector_base<cnn::Node_*,_std::allocator<cnn::Node_*>_>._M_impl.
        super__Vector_impl_data._M_finish._0_4_ = *(undefined4 *)(lVar3 + 0x58);
        local_118.nodes.super__Vector_base<cnn::Node_*,_std::allocator<cnn::Node_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = *(pointer *)(lVar3 + 0x30);
        local_118.parameter_nodes.
        super__Vector_base<cnn::VariableIndex,_std::allocator<cnn::VariableIndex>_>._M_impl.
        super__Vector_impl_data._M_start._0_4_ = *(undefined4 *)(lVar3 + 0x38);
        local_c8._M_len = 3;
      }
      local_118.parameter_nodes.
      super__Vector_base<cnn::VariableIndex,_std::allocator<cnn::VariableIndex>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)local_98;
      local_118.parameter_nodes.
      super__Vector_base<cnn::VariableIndex,_std::allocator<cnn::VariableIndex>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._0_4_ = uVar6;
      local_c8._M_array = (iterator)&local_118;
      expr::detail::f<cnn::AffineTransform,std::initializer_list<cnn::expr::Expression>>
                ((detail *)&local_148,&local_c8);
      local_138 = (undefined1  [8])local_148.pg;
      local_130._0_4_ = local_148.i.t;
      expr::logistic((expr *)&local_118,(Expression *)local_138);
      local_138 = (undefined1  [8])
                  local_118.nodes.super__Vector_base<cnn::Node_*,_std::allocator<cnn::Node_*>_>.
                  _M_impl.super__Vector_impl_data._M_start;
      local_130 = CONCAT44(local_130._4_4_,
                           (uint)local_118.nodes.
                                 super__Vector_base<cnn::Node_*,_std::allocator<cnn::Node_*>_>.
                                 _M_impl.super__Vector_impl_data._M_finish);
      local_148.pg = (ComputationGraph *)0x0;
      local_148.i.t = 0;
      if (bVar9 || bVar8) {
        expr::cwise_multiply((expr *)&local_c8,(Expression *)local_138,&local_b0);
        lVar3 = *(long *)(local_a0 + lVar7);
        local_118.nodes.super__Vector_base<cnn::Node_*,_std::allocator<cnn::Node_*>_>._M_impl.
        super__Vector_impl_data._M_start = *(pointer *)(lVar3 + 0x80);
        local_118.nodes.super__Vector_base<cnn::Node_*,_std::allocator<cnn::Node_*>_>._M_impl.
        super__Vector_impl_data._M_finish._0_4_ = *(uint *)(lVar3 + 0x88);
        local_118.nodes.super__Vector_base<cnn::Node_*,_std::allocator<cnn::Node_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = *(pointer *)(lVar3 + 0x60);
        local_118.parameter_nodes.
        super__Vector_base<cnn::VariableIndex,_std::allocator<cnn::VariableIndex>_>._M_impl.
        super__Vector_impl_data._M_start._0_4_ = *(undefined4 *)(lVar3 + 0x68);
        local_118.parameter_nodes.
        super__Vector_base<cnn::VariableIndex,_std::allocator<cnn::VariableIndex>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)local_98;
        local_118.ee = *(ExecutionEngine **)(lVar3 + 0x70);
        local_e0 = *(undefined4 *)(lVar3 + 0x78);
        local_d8 = (ComputationGraph *)local_c8._M_array;
        local_d0 = (uint)local_c8._M_len;
        local_70._M_len = 5;
        local_118.parameter_nodes.
        super__Vector_base<cnn::VariableIndex,_std::allocator<cnn::VariableIndex>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._0_4_ = uVar6;
        local_70._M_array = (iterator)&local_118;
        expr::detail::f<cnn::AffineTransform,std::initializer_list<cnn::expr::Expression>>
                  ((detail *)local_60,&local_70);
        local_148.pg = (ComputationGraph *)local_60;
        local_148.i.t = local_58._0_4_;
        expr::tanh((expr *)&local_118,__x_00);
        local_148.pg = (ComputationGraph *)
                       local_118.nodes.super__Vector_base<cnn::Node_*,_std::allocator<cnn::Node_*>_>
                       ._M_impl.super__Vector_impl_data._M_start;
        local_148.i.t =
             (uint)local_118.nodes.super__Vector_base<cnn::Node_*,_std::allocator<cnn::Node_*>_>.
                   _M_impl.super__Vector_impl_data._M_finish;
        expr::cwise_multiply((expr *)&local_118,&local_128,&local_148);
        expr::cwise_multiply((expr *)local_60,&local_88,&local_b0);
        expr::operator+((expr *)&local_70,(Expression *)local_60,(Expression *)&local_118);
        lVar3 = *(long *)(local_90 + -0x18);
        *(iterator *)(lVar3 + -8 + lVar4) = local_70._M_array;
        local_118.nodes.super__Vector_base<cnn::Node_*,_std::allocator<cnn::Node_*>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)local_70._M_array;
        uVar6 = (uint)local_70._M_len;
      }
      else {
        lVar3 = *(long *)(local_a0 + lVar7);
        local_118.nodes.super__Vector_base<cnn::Node_*,_std::allocator<cnn::Node_*>_>._M_impl.
        super__Vector_impl_data._M_start = *(pointer *)(lVar3 + 0x80);
        local_118.nodes.super__Vector_base<cnn::Node_*,_std::allocator<cnn::Node_*>_>._M_impl.
        super__Vector_impl_data._M_finish._0_4_ = *(uint *)(lVar3 + 0x88);
        local_118.nodes.super__Vector_base<cnn::Node_*,_std::allocator<cnn::Node_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = *(pointer *)(lVar3 + 0x60);
        local_118.parameter_nodes.
        super__Vector_base<cnn::VariableIndex,_std::allocator<cnn::VariableIndex>_>._M_impl.
        super__Vector_impl_data._M_start._0_4_ = *(undefined4 *)(lVar3 + 0x68);
        local_118.parameter_nodes.
        super__Vector_base<cnn::VariableIndex,_std::allocator<cnn::VariableIndex>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)local_98;
        local_58 = 3;
        local_118.parameter_nodes.
        super__Vector_base<cnn::VariableIndex,_std::allocator<cnn::VariableIndex>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._0_4_ = uVar6;
        local_60 = (undefined1  [8])&local_118;
        expr::detail::f<cnn::AffineTransform,std::initializer_list<cnn::expr::Expression>>
                  ((detail *)&local_c8,(initializer_list<cnn::expr::Expression> *)local_60);
        local_148.pg = (ComputationGraph *)local_c8._M_array;
        local_148.i.t = (uint)local_c8._M_len;
        expr::tanh((expr *)&local_118,__x);
        local_148.pg = (ComputationGraph *)
                       local_118.nodes.super__Vector_base<cnn::Node_*,_std::allocator<cnn::Node_*>_>
                       ._M_impl.super__Vector_impl_data._M_start;
        local_148.i.t =
             (uint)local_118.nodes.super__Vector_base<cnn::Node_*,_std::allocator<cnn::Node_*>_>.
                   _M_impl.super__Vector_impl_data._M_finish;
        expr::cwise_multiply((expr *)&local_118,&local_128,&local_148);
        lVar3 = *(long *)(local_90 + -0x18);
        *(pointer *)(lVar3 + -8 + lVar4) =
             local_118.nodes.super__Vector_base<cnn::Node_*,_std::allocator<cnn::Node_*>_>._M_impl.
             super__Vector_impl_data._M_start;
        uVar6 = (uint)local_118.nodes.super__Vector_base<cnn::Node_*,_std::allocator<cnn::Node_*>_>.
                      _M_impl.super__Vector_impl_data._M_finish;
      }
      *(uint *)(lVar3 + lVar4) = uVar6;
      uVar5 = uVar5 + 1;
      lVar7 = lVar7 + 0x18;
      lVar4 = lVar4 + 0x10;
      local_118.parameter_nodes.
      super__Vector_base<cnn::VariableIndex,_std::allocator<cnn::VariableIndex>_>._M_impl.
      super__Vector_impl_data._M_finish =
           (pointer)local_118.nodes.super__Vector_base<cnn::Node_*,_std::allocator<cnn::Node_*>_>.
                    _M_impl.super__Vector_impl_data._M_start;
    } while (uVar5 < *(uint *)(local_78 + 0x8c));
  }
  lVar4 = *(long *)(local_90 + -0x10);
  (local_50->super_RNNBuilder)._vptr_RNNBuilder = *(_func_int ***)(lVar4 + -0x10);
  (local_50->super_RNNBuilder).cur.t = *(int *)(lVar4 + -8);
  EVar10._8_8_ = lVar4;
  EVar10.pg = (ComputationGraph *)local_50;
  return EVar10;
}

Assistant:

Expression GRUBuilder::add_input_impl(int prev, const Expression& x) {
  const bool has_initial_state = (h0.size() > 0);
  h.push_back(vector<Expression>(layers));
  vector<Expression>& ht = h.back();
  Expression in = x;
  for (unsigned i = 0; i < layers; ++i) {
    const vector<Expression>& vars = param_vars[i];
    Expression h_tprev;
    // prev_zero means that h_tprev should be treated as 0
    bool prev_zero = false;
    if (prev >= 0 || has_initial_state) {
      h_tprev = (prev < 0) ? h0[i] : h[prev][i];
    } else { prev_zero = true; }
    // update gate
    Expression zt;
    if (prev_zero)
      zt = affine_transform({vars[BZ], vars[X2Z], in});
    else
      zt = affine_transform({vars[BZ], vars[X2Z], in, vars[H2Z], h_tprev});
    zt = logistic(zt);
    // forget
    Expression ft = 1.f - zt;
    // reset gate
    Expression rt;
    if (prev_zero)
      rt = affine_transform({vars[BR], vars[X2R], in});
    else
      rt = affine_transform({vars[BR], vars[X2R], in, vars[H2R], h_tprev});
    rt = logistic(rt);

    // candidate activation
    Expression ct;
    if (prev_zero) {
      ct = affine_transform({vars[BH], vars[X2H], in});
      ct = tanh(ct);
      Expression nwt = cwise_multiply(zt, ct);
      in = ht[i] = nwt;
    } else {
      Expression ght = cwise_multiply(rt, h_tprev);
      ct = affine_transform({vars[BH], vars[X2H], in, vars[H2H], ght});
      ct = tanh(ct);
      Expression nwt = cwise_multiply(zt, ct);
      Expression crt = cwise_multiply(ft, h_tprev);
      in = ht[i] = crt + nwt;
    }
  }
  return ht.back();
}